

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O1

void __thiscall Channel::~Channel(Channel *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  p_Var2 = (this->connHandler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->connHandler_,(_Any_data *)&this->connHandler_,__destroy_functor);
  }
  p_Var2 = (this->errorHandler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->errorHandler_,(_Any_data *)&this->errorHandler_,__destroy_functor)
    ;
  }
  p_Var2 = (this->writeHandler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->writeHandler_,(_Any_data *)&this->writeHandler_,__destroy_functor)
    ;
  }
  p_Var2 = (this->readHandler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->readHandler_,(_Any_data *)&this->readHandler_,__destroy_functor);
  }
  p_Var3 = (this->holder_).super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Channel::~Channel(){
    // close(fd_);
}